

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::Client::write_request(Client *this,Stream *strm,Request *req)

{
  string *psVar1;
  Headers *this_00;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong __val;
  bool bVar4;
  Stream *pSVar5;
  char cVar6;
  int iVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  char cVar11;
  string length;
  BufferStream bstrm;
  string path;
  pointer local_c0;
  key_type local_b8;
  Request *local_98;
  _func_int **local_90;
  Stream local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  Stream *local_60;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_80 = &local_70;
  local_90 = (_func_int **)&PTR__BufferStream_0016f2d0;
  local_88._vptr_Stream = (_func_int **)&PTR__BufferStream_0016f2d0;
  local_78 = 0;
  local_70 = 0;
  detail::encode_url(&local_58,&req->path);
  local_b8._M_dataplus._M_p = (req->method)._M_dataplus._M_p;
  local_c0 = local_58._M_dataplus._M_p;
  local_98 = req;
  Stream::write_format<char_const*,char_const*>
            (&local_88,"%s %s HTTP/1.1\r\n",(char **)&local_b8,&local_c0);
  iVar7 = (*this->_vptr_Client[4])(this);
  this_00 = &local_98->headers;
  if ((char)iVar7 == '\0') {
    if (this->port_ == 0x50) {
      local_c0 = (this->host_)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = "Host";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)&local_b8,&local_c0);
    }
    else {
      local_c0 = (this->host_and_port_)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = "Host";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)&local_b8,&local_c0);
    }
  }
  else if (this->port_ == 0x1bb) {
    local_c0 = (this->host_)._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = "Host";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&local_b8,&local_c0);
  }
  else {
    local_c0 = (this->host_and_port_)._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = "Host";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&local_b8,&local_c0);
  }
  paVar3 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Accept","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = &(local_98->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
    local_b8._M_dataplus._M_p = "Accept";
    local_c0 = "*/*";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&local_b8,&local_c0);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"User-Agent","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
    local_b8._M_dataplus._M_p = "User-Agent";
    local_c0 = "cpp-httplib/0.2";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&local_b8,&local_c0);
  }
  local_b8._M_dataplus._M_p = "Connection";
  local_c0 = "close";
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const*&,char_const*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this_00,(char **)&local_b8,&local_c0);
  if ((local_98->body)._M_string_length == 0) {
    psVar1 = &local_98->method;
    iVar7 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar7 != 0) goto LAB_0014d0ab;
    }
    local_b8._M_dataplus._M_p = "Content-Length";
    local_c0 = "0";
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char **)&local_b8,&local_c0);
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Content-Type","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
      local_b8._M_dataplus._M_p = "Content-Type";
      local_c0 = "text/plain";
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const*&,char_const*&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char **)&local_b8,&local_c0);
    }
    __val = (local_98->body)._M_string_length;
    cVar11 = '\x01';
    if (9 < __val) {
      uVar10 = __val;
      cVar6 = '\x04';
      do {
        cVar11 = cVar6;
        if (uVar10 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_0014d04b;
        }
        if (uVar10 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_0014d04b;
        }
        if (uVar10 < 10000) goto LAB_0014d04b;
        bVar4 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar6 = cVar11 + '\x04';
      } while (bVar4);
      cVar11 = cVar11 + '\x01';
    }
LAB_0014d04b:
    local_b8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b8._M_dataplus._M_p,(uint)local_b8._M_string_length,__val);
    local_c0 = "Content-Length";
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8._M_dataplus._M_p;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const*&,char_const*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,&local_c0,(char **)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0014d0ab:
  p_Var9 = (local_98->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60 = strm;
  if ((_Rb_tree_header *)p_Var9 != p_Var2) {
    do {
      local_b8._M_dataplus._M_p = *(pointer *)(p_Var9 + 1);
      local_c0 = *(pointer *)(p_Var9 + 2);
      Stream::write_format<char_const*,char_const*>
                (&local_88,"%s: %s\r\n",(char **)&local_b8,&local_c0);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var2);
  }
  (*local_88._vptr_Stream[4])(&local_88,"\r\n");
  pSVar5 = local_60;
  if ((local_98->body)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_80,(ulong)(local_98->body)._M_dataplus._M_p);
  }
  (*pSVar5->_vptr_Stream[3])(pSVar5,local_80,local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_88._vptr_Stream = local_90;
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return;
}

Assistant:

inline void Client::write_request(Stream& strm, Request& req)
{
    BufferStream bstrm;

    // Request line
    auto path = detail::encode_url(req.path);

    bstrm.write_format("%s %s HTTP/1.1\r\n",
        req.method.c_str(),
        path.c_str());

    // Headers
    if (is_ssl()) {
        if (port_ == 443) {
            req.set_header("Host", host_.c_str());
        } else {
            req.set_header("Host", host_and_port_.c_str());
        }
    } else {
        if (port_ == 80) {
            req.set_header("Host", host_.c_str());
        } else {
            req.set_header("Host", host_and_port_.c_str());
        }
    }

    if (!req.has_header("Accept")) {
        req.set_header("Accept", "*/*");
    }

    if (!req.has_header("User-Agent")) {
        req.set_header("User-Agent", "cpp-httplib/0.2");
    }

    // TODO: Support KeepAlive connection
    // if (!req.has_header("Connection")) {
        req.set_header("Connection", "close");
    // }

    if (req.body.empty()) {
        if (req.method == "POST" || req.method == "PUT") {
            req.set_header("Content-Length", "0");
        }
    } else {
        if (!req.has_header("Content-Type")) {
            req.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(req.body.size());
        req.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(bstrm, req);

    // Body
    if (!req.body.empty()) {
        bstrm.write(req.body.c_str(), req.body.size());
    }

    // Flush buffer
    auto& data = bstrm.get_buffer();
    strm.write(data.data(), data.size());
}